

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void __thiscall deqp::gles31::bb::BlockLayoutEntry::~BlockLayoutEntry(BlockLayoutEntry *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->activeVarIndices).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

BlockLayoutEntry (void)
		: size(0)
	{
	}